

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O0

void __thiscall
pm::PinHole::renderScene
          (PinHole *this,World *world,Tracer *tracer,RGBColor *frame,int startX,int startY,
          int tileWidth,int tileHeight,bool progressive)

{
  int iVar1;
  ViewPlane *this_00;
  SamplerState *pSVar2;
  float fVar3;
  int local_b4;
  RGBColor local_a4;
  undefined1 local_98 [20];
  float y;
  float x;
  Vector2 sp;
  int j;
  RGBColor pixel;
  int c;
  int r;
  int numSamples;
  float pixelSize;
  int depth;
  ViewPlane *vp;
  Ray ray;
  bool progressive_local;
  int startY_local;
  int startX_local;
  RGBColor *frame_local;
  Tracer *tracer_local;
  World *world_local;
  PinHole *this_local;
  
  ray.d.y._3_1_ = progressive;
  ray.d.z = (float)startY;
  Ray::Ray((Ray *)((long)&vp + 4));
  Vector3::operator=((Vector3 *)((long)&vp + 4),&(this->super_Camera).eye_);
  this_00 = World::viewPlane(world);
  fVar3 = ViewPlane::pixelSize(this_00);
  fVar3 = fVar3 / this->zoom_;
  if ((ray.d.y._3_1_ & 1) == 0) {
    pSVar2 = ViewPlane::samplerState(this_00);
    local_b4 = SamplerState::numSamples(pSVar2);
  }
  else {
    local_b4 = 1;
  }
  for (pixel.b = ray.d.z; pixel.g = (float)startX, (int)pixel.b < (int)ray.d.z + tileHeight;
      pixel.b = (float)((int)pixel.b + 1)) {
    for (; (int)pixel.g < startX + tileWidth; pixel.g = (float)((int)pixel.g + 1)) {
      RGBColor::RGBColor((RGBColor *)&sp.y,0.0,0.0,0.0);
      for (sp.x = 0.0; (int)sp.x < local_b4; sp.x = (float)((int)sp.x + 1)) {
        ViewPlane::samplerState(this_00);
        SamplerState::sampleUnitSquare((SamplerState *)&y);
        iVar1 = ViewPlane::width(this_00);
        local_98._16_4_ = fVar3 * ((float)iVar1 * -0.5 + (float)(int)pixel.g + y);
        iVar1 = ViewPlane::height(this_00);
        local_98._12_4_ = fVar3 * ((float)iVar1 * -0.5 + (float)(int)pixel.b + x);
        rayDirection((PinHole *)local_98,(float)local_98._16_4_,(float)local_98._12_4_);
        Vector3::operator=((Vector3 *)&ray.o.y,(Vector3 *)local_98);
        (*tracer->_vptr_Tracer[3])(&local_a4,tracer,world,(long)&vp + 4,0);
        RGBColor::operator+=((RGBColor *)&sp.y,&local_a4);
      }
      pSVar2 = ViewPlane::samplerState(this_00);
      iVar1 = SamplerState::numSamples(pSVar2);
      RGBColor::operator/=((RGBColor *)&sp.y,(float)iVar1);
      RGBColor::operator*=((RGBColor *)&sp.y,(this->super_Camera).exposureTime_);
      iVar1 = ViewPlane::width(this_00);
      RGBColor::operator+=(frame + ((int)pixel.b * iVar1 + (int)pixel.g),(RGBColor *)&sp.y);
    }
  }
  return;
}

Assistant:

void PinHole::renderScene(World &world, Tracer &tracer, RGBColor *frame, int startX, int startY, int tileWidth, int tileHeight, bool progressive)
{
	Ray ray;
	ray.o = eye_;
	const ViewPlane &vp = world.viewPlane();

	int depth = 0; // recursion depth
	const float pixelSize = vp.pixelSize() / zoom_;

	const int numSamples = progressive ? 1 : vp.samplerState().numSamples();
	for (int r = startY; r < startY + tileHeight; r++)
	{
		for (int c = startX; c < startX + tileWidth; c++)
		{
			RGBColor pixel(0.0f, 0.0f, 0.0f);
			for (int j = 0; j < numSamples; j++)
			{
				const Vector2 sp = vp.samplerState().sampleUnitSquare();
				const float x = pixelSize * (c - 0.5f * vp.width() + sp.x);
				const float y = pixelSize * (r - 0.5f * vp.height() + sp.y);
				ray.d = rayDirection(x, y);
				pixel += tracer.traceRay(world, ray, depth);
			}
			// Divide by number of samples even in progressive mode or the image gets too bright
			pixel /= static_cast<float>(vp.samplerState().numSamples());
			pixel *= exposureTime_;
			frame[r * vp.width() + c] += pixel;
		}
	}
}